

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall iDynTree::InverseKinematics::solve(InverseKinematics *this)

{
  missingIpoptErrorReport();
  return false;
}

Assistant:

bool InverseKinematics::solve()
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->solveProblem();
#else
        return missingIpoptErrorReport();
#endif
    }